

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransformDerivative.cpp
# Opt level: O2

Matrix4x4 * __thiscall
iDynTree::TransformDerivative::asHomogeneousTransformDerivative
          (Matrix4x4 *__return_storage_ptr__,TransformDerivative *this)

{
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> dR;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> dp;
  undefined1 local_60 [32];
  variable_if_dynamic<long,__1> local_40;
  variable_if_dynamic<long,__1> vStack_38;
  Index local_30;
  
  dR.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (this->rotDerivative).m_data;
  local_40.m_value = 0;
  vStack_38.m_value = 0;
  local_30 = 4;
  dp.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)this;
  local_60._0_8_ = __return_storage_ptr__;
  local_60._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,4,4,1,4,4>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_60,&dR);
  local_60._0_8_ = __return_storage_ptr__->m_data + 3;
  local_40.m_value = 0;
  vStack_38.m_value = 3;
  local_30 = 1;
  local_60._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,4,4,1,4,4>,0,Eigen::Stride<0,0>>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
              *)local_60,&dp);
  local_60._0_8_ = __return_storage_ptr__->m_data + 0xc;
  local_40.m_value = 3;
  vStack_38.m_value = 0;
  local_30 = 4;
  local_60._16_8_ = __return_storage_ptr__;
  Eigen::
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>,_1,_4,_false>_>
  ::setZero((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>,_1,_4,_false>_>
             *)local_60);
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 TransformDerivative::asHomogeneousTransformDerivative() const
{
    Matrix4x4 ret;

    Eigen::Map< Eigen::Matrix<double,4,4,Eigen::RowMajor> > retEigen(ret.data());

    Eigen::Map<const Eigen::Vector3d> dp(this->posDerivative.data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > dR(this->rotDerivative.data());

    retEigen.block<3,3>(0,0) = dR;
    retEigen.block<3,1>(0,3) = dp;
    retEigen.block<1,4>(3,0).setZero();

    return ret;
}